

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintEndTag(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  uint uVar1;
  uint local_3c;
  byte *pbStack_38;
  tchar c;
  tmbstr s;
  TidyPrintImpl *pTStack_28;
  Bool uc;
  TidyPrintImpl *pprint;
  Node *node_local;
  uint indent_local;
  uint mode_local;
  TidyDocImpl *doc_local;
  
  pTStack_28 = &doc->pprint;
  s._4_4_ = (int)(doc->config).value[0x54].v;
  pbStack_38 = (byte *)node->element;
  pprint = (TidyPrintImpl *)node;
  node_local._0_4_ = indent;
  node_local._4_4_ = mode;
  _indent_local = doc;
  AddString(pTStack_28,"</");
  if (pbStack_38 != (byte *)0x0) {
    for (; *pbStack_38 != 0; pbStack_38 = pbStack_38 + 1) {
      local_3c = (uint)*pbStack_38;
      if (local_3c < 0x80) {
        if (s._4_4_ != 0) {
          local_3c = prvTidyToUpper(local_3c);
        }
      }
      else {
        uVar1 = prvTidyGetUTF8((ctmbstr)pbStack_38,&local_3c);
        pbStack_38 = pbStack_38 + uVar1;
      }
      AddChar(pTStack_28,local_3c);
    }
  }
  AddChar(pTStack_28,0x3e);
  return;
}

Assistant:

static void PPrintEndTag( TidyDocImpl* doc, uint ARG_UNUSED(mode),
                          uint ARG_UNUSED(indent), Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool uc = cfgBool( doc, TidyUpperCaseTags );
    tmbstr s = node->element;
    tchar c;

    AddString( pprint, "</" );

    if (s)
    {
        while (*s)
        {
             c = (unsigned char)*s;

             if (c > 0x7F)
                 s += TY_(GetUTF8)(s, &c);
             else if (uc)
                 c = TY_(ToUpper)(c);

             AddChar(pprint, c);
             ++s;
        }
    }

    AddChar( pprint, '>' );
}